

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ConvolutionLayerParams::InternalSwap
          (ConvolutionLayerParams *this,ConvolutionLayerParams *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WeightParams *pWVar4;
  uint64 uVar5;
  ConvolutionPaddingTypeUnion CVar6;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->kernelsize_,&other->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->stride_,&other->stride_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->dilationfactor_,&other->dilationfactor_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  pWVar4 = this->weights_;
  this->weights_ = other->weights_;
  other->weights_ = pWVar4;
  pWVar4 = this->bias_;
  this->bias_ = other->bias_;
  other->bias_ = pWVar4;
  uVar5 = this->outputchannels_;
  this->outputchannels_ = other->outputchannels_;
  other->outputchannels_ = uVar5;
  uVar5 = this->kernelchannels_;
  this->kernelchannels_ = other->kernelchannels_;
  other->kernelchannels_ = uVar5;
  uVar5 = this->ngroups_;
  this->ngroups_ = other->ngroups_;
  other->ngroups_ = uVar5;
  bVar1 = this->isdeconvolution_;
  this->isdeconvolution_ = other->isdeconvolution_;
  other->isdeconvolution_ = bVar1;
  bVar1 = this->hasbias_;
  this->hasbias_ = other->hasbias_;
  other->hasbias_ = bVar1;
  CVar6 = this->ConvolutionPaddingType_;
  this->ConvolutionPaddingType_ = other->ConvolutionPaddingType_;
  other->ConvolutionPaddingType_ = CVar6;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void ConvolutionLayerParams::InternalSwap(ConvolutionLayerParams* other) {
  kernelsize_.InternalSwap(&other->kernelsize_);
  stride_.InternalSwap(&other->stride_);
  dilationfactor_.InternalSwap(&other->dilationfactor_);
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(weights_, other->weights_);
  std::swap(bias_, other->bias_);
  std::swap(outputchannels_, other->outputchannels_);
  std::swap(kernelchannels_, other->kernelchannels_);
  std::swap(ngroups_, other->ngroups_);
  std::swap(isdeconvolution_, other->isdeconvolution_);
  std::swap(hasbias_, other->hasbias_);
  std::swap(ConvolutionPaddingType_, other->ConvolutionPaddingType_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}